

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt
          (LocationRecorder *this,LocationRecorder *other)

{
  int iVar1;
  Location *pLVar2;
  Location *pLVar3;
  LogMessage *pLVar4;
  int *piVar5;
  LogFinisher local_111;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pLVar2 = this->location_;
  pLVar3 = other->location_;
  if ((pLVar3->span_).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar4 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  piVar5 = RepeatedField<int>::elements(&pLVar3->span_);
  iVar1 = *piVar5;
  if ((pLVar2->span_).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29c);
    pLVar4 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  piVar5 = RepeatedField<int>::elements(&pLVar2->span_);
  *piVar5 = iVar1;
  pLVar2 = this->location_;
  pLVar3 = other->location_;
  if ((pLVar3->span_).current_size_ < 2) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  piVar5 = RepeatedField<int>::elements(&pLVar3->span_);
  iVar1 = piVar5[1];
  if ((pLVar2->span_).current_size_ < 2) {
    internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29c);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: (index) < (current_size_): ");
    internal::LogFinisher::operator=(&local_111,pLVar4);
    internal::LogMessage::~LogMessage(&local_110);
  }
  piVar5 = RepeatedField<int>::elements(&pLVar2->span_);
  piVar5[1] = iVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const LocationRecorder& other) {
  location_->set_span(0, other.location_->span(0));
  location_->set_span(1, other.location_->span(1));
}